

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

int tx_size_to_depth(TX_SIZE tx_size,BLOCK_SIZE bsize)

{
  int depth;
  TX_SIZE ctx_size;
  BLOCK_SIZE bsize_local;
  TX_SIZE tx_size_local;
  
  ctx_size = ""[bsize];
  depth = 0;
  for (; tx_size != ctx_size; ctx_size = ""[ctx_size]) {
    depth = depth + 1;
  }
  return depth;
}

Assistant:

static inline int tx_size_to_depth(TX_SIZE tx_size, BLOCK_SIZE bsize) {
  TX_SIZE ctx_size = max_txsize_rect_lookup[bsize];
  int depth = 0;
  while (tx_size != ctx_size) {
    depth++;
    ctx_size = sub_tx_size_map[ctx_size];
    assert(depth <= MAX_TX_DEPTH);
  }
  return depth;
}